

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool CoreML::hasGrayscaleFloat16Image(Model *model)

{
  int iVar1;
  Rep *pRVar2;
  ModelDescription *pMVar3;
  ImageFeatureType *pIVar4;
  FeatureType *pFVar5;
  long lVar6;
  void **ppvVar7;
  bool bVar8;
  
  pMVar3 = model->description_;
  if (pMVar3 == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  pRVar2 = (pMVar3->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  iVar1 = (pMVar3->input_).super_RepeatedPtrFieldBase.current_size_;
  lVar6 = 0;
  while( true ) {
    if ((long)iVar1 * 8 == lVar6) {
      pMVar3 = model->description_;
      if (pMVar3 == (ModelDescription *)0x0) {
        pMVar3 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
      }
      pRVar2 = (pMVar3->output_).super_RepeatedPtrFieldBase.rep_;
      ppvVar7 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar7 = (void **)0x0;
      }
      iVar1 = (pMVar3->output_).super_RepeatedPtrFieldBase.current_size_;
      lVar6 = 0;
      while( true ) {
        bVar8 = (long)iVar1 * 8 != lVar6;
        if (!bVar8) {
          return bVar8;
        }
        pFVar5 = *(FeatureType **)(*(long *)((long)ppvVar7 + lVar6) + 0x20);
        if (pFVar5 == (FeatureType *)0x0) {
          pFVar5 = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        if ((pFVar5->_oneof_case_[0] == 5) &&
           (pIVar4 = Specification::FeatureType::imagetype(pFVar5), pIVar4->colorspace_ == 0x28))
        break;
        lVar6 = lVar6 + 8;
      }
      return bVar8;
    }
    pFVar5 = *(FeatureType **)(*(long *)((long)ppvVar7 + lVar6) + 0x20);
    if (pFVar5 == (FeatureType *)0x0) {
      pFVar5 = (FeatureType *)&Specification::_FeatureType_default_instance_;
    }
    if ((pFVar5->_oneof_case_[0] == 4) &&
       (pIVar4 = Specification::FeatureType::imagetype(pFVar5), pIVar4->colorspace_ == 0x28)) break;
    lVar6 = lVar6 + 8;
  }
  return true;
}

Assistant:

bool CoreML::hasGrayscaleFloat16Image(const Specification::Model& model) {
    for (const auto& input: model.description().input()) {
        if (input.type().Type_case() == Specification::FeatureType::kImageType) {
            if (input.type().imagetype().colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16) {
                return true;
            }
        }
    }

    for (const auto& output: model.description().output()) {
        if (output.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
            if (output.type().imagetype().colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16) {
                return true;
            }
        }
    }

    return false;
}